

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

S1Interval __thiscall S1Interval::Intersection(S1Interval *this,S1Interval *y)

{
  Vector2_d VVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  VType p;
  S1Interval local_48;
  double local_30;
  S2LogMessage local_28;
  
  local_30 = (y->bounds_).c_[0];
  p = (y->bounds_).c_[1];
  if ((((local_30 != 3.141592653589793) || (NAN(local_30))) || (p != -3.141592653589793)) ||
     (NAN(p))) {
    bVar2 = FastContains(this,local_30);
    bVar3 = FastContains(this,p);
    if (bVar2) {
      if (bVar3) {
        dVar4 = GetLength(y);
        dVar5 = GetLength(this);
        if (dVar4 < dVar5) {
          local_48.bounds_.c_[0] = (y->bounds_).c_[0];
          local_48.bounds_.c_[1] = (y->bounds_).c_[1];
          goto LAB_001e5546;
        }
LAB_001e553c:
        local_48.bounds_.c_[0] = (this->bounds_).c_[0];
        local_48.bounds_.c_[1] = (this->bounds_).c_[1];
        goto LAB_001e5546;
      }
      p = (this->bounds_).c_[1];
      dVar4 = local_30;
    }
    else {
      dVar4 = (this->bounds_).c_[0];
      if (!bVar3) {
        bVar2 = FastContains(y,dVar4);
        if (bVar2) goto LAB_001e553c;
        bVar2 = Intersects(this,y);
        if (bVar2) {
          S2LogMessage::S2LogMessage
                    (&local_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
                     ,0x117,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_28.stream_,"Check failed: !Intersects(y) ");
          abort();
        }
        goto LAB_001e549d;
      }
    }
    S1Interval(&local_48,dVar4,p,ARGS_CHECKED);
  }
  else {
LAB_001e549d:
    local_48.bounds_.c_[0] = 3.141592653589793;
    local_48.bounds_.c_[1] = -3.141592653589793;
  }
LAB_001e5546:
  VVar1.c_[1] = local_48.bounds_.c_[1];
  VVar1.c_[0] = local_48.bounds_.c_[0];
  return (Vector2_d)(Vector2_d)VVar1.c_;
}

Assistant:

S1Interval S1Interval::Intersection(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return Empty();
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the region of intersection
      // consists of two disjoint subintervals.  In either case, we want
      // to return the shorter of the two original intervals.
      if (y.GetLength() < GetLength()) return y;  // is_full() code path
      return *this;
    }
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(lo(), y.hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.

  if (y.FastContains(lo())) return *this;  // is_empty() okay here
  S2_DCHECK(!Intersects(y));
  return Empty();
}